

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# helper.cpp
# Opt level: O3

error assemble_signed_20bit_immediate(context *ctx,token *token,opcode *op)

{
  undefined8 uVar1;
  undefined8 *in_RCX;
  error *tmpres___LINE__;
  int64_t value;
  token local_48;
  
  convert_integer((token *)ctx,(int64_t)op,-0x80000,(uint64_t *)0x7ffff);
  if (ctx->pc == 0) {
    uVar1 = *in_RCX;
    *in_RCX = uVar1;
    *in_RCX = uVar1;
    context::tokenize(&local_48,(context *)token);
    *(int *)&op[2].value = local_48.column;
    op[1].value = (uint64_t)local_48.data.string._M_str;
    op[1].reuse = local_48.type;
    op[1].sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.line;
    op->value = (uint64_t)local_48.filename;
    op->reuse = local_48.data.predicate.index;
    op->sched = (anon_union_4_2_f99a8bb9_for_sched)local_48.data.predicate.negated;
    ctx->pc = 0;
  }
  return (unique_ptr<char[],_std::default_delete<char[]>_>)
         (unique_ptr<char[],_std::default_delete<char[]>_>)ctx;
}

Assistant:

error assemble_signed_20bit_immediate(context& ctx, token& token, opcode& op)
{
    int64_t value = 0;
    CHECK(convert_integer(token, -(1 << 19), max_bits(19), reinterpret_cast<uint64_t*>(&value)));

    uint64_t raw = 0;
    uint64_t negative = 0;
    if (value < 0) {
        raw = (value - (1 << 19)) & max_bits(19);
        negative = 1;
    } else {
        raw = static_cast<uint64_t>(value);
        negative = 0;
    }

    op.add_bits(raw << 20);
    op.add_bits(negative << 56);

    token = ctx.tokenize();
    return {};
}